

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CPU.cpp
# Opt level: O1

void __thiscall CPU::DEC_AB_X(CPU *this)

{
  uint16_t uVar1;
  uint uVar2;
  uint uVar3;
  
  this->cycles = 7;
  uVar1 = GetWord(this);
  this->cycles = this->cycles - 1;
  uVar3 = (uint)this->X + (uint)uVar1 & 0xffff;
  uVar2 = (*this->memory->_vptr_MemoryBus[2])(this->memory,(ulong)uVar3);
  this->cycles = this->cycles - 2;
  uVar2 = (uVar2 & 0xff) - 1;
  (*this->memory->_vptr_MemoryBus[3])(this->memory,(ulong)uVar3,(ulong)(uVar2 & 0xff));
  this->cycles = this->cycles - 1;
  (this->field_6).ps = (byte)uVar2 & 0x80 | ((short)uVar2 == 0) * '\x02' | (this->field_6).ps & 0x7d
  ;
  return;
}

Assistant:

void CPU::DEC_AB_X()
{
    cycles = 7;
    uint16_t addr = GetWord() + X, result = ReadByte(addr) - 1;
    cycles -= 2;
    WriteByte(addr, result);
    Z = (result == 0);
    N = (result & 0b10000000) > 0;
}